

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

void EthBasePort::PrintFirewirePacket(ostream *out,quadlet_t *packet,uint max_quads)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  char *__s;
  char cVar4;
  uint uVar5;
  ostream *poVar6;
  ostream *poVar7;
  size_t sVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong local_50;
  
  if (max_quads < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"PrintPacket: should print more than 4 quadlets (max_quads = ",0x3c);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    lVar14 = *(long *)poVar6;
    goto LAB_00116b69;
  }
  bVar2 = (byte)*packet;
  bVar10 = bVar2 >> 4;
  std::__ostream_insert<char,std::char_traits<char>>(out,"Firewire Packet:",0x10);
  cVar4 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"  dest: ",8);
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", node: ",8);
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", tl: ",6);
  lVar14 = *(long *)poVar7;
  *(uint *)(poVar7 + *(long *)(lVar14 + -0x18) + 0x18) =
       *(uint *)(poVar7 + *(long *)(lVar14 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar7 + *(long *)(lVar14 + -0x18) + 0x10) = 2;
  poVar6 = poVar7 + *(long *)(lVar14 + -0x18);
  if (poVar7[*(long *)(lVar14 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar6);
    poVar6[0xe1] = (ostream)0x1;
  }
  poVar6[0xe0] = (ostream)0x30;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", rt: ",6);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", tcode: ",9);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
  __s = PrintFirewirePacket::tcode_name[bVar10];
  sVar8 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", pri: ",7);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"  src: ",7);
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", node: ",8);
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  if ((bVar2 & 0xe0) == 0x60) {
    std::__ostream_insert<char,std::char_traits<char>>(out,", rcode: ",9);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  else if ((((bVar2 & 0xb0) == 0x10) || (bVar2 < 0x10)) || (bVar10 == 4)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,", dest_off: ",0xc);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(out,"  dest_off: ",0xc);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  if ((bVar10 < 8) && ((0xa2U >> bVar10 & 1) != 0)) {
    uVar3 = packet[3];
    local_50 = (ulong)(uVar3 >> 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(out,"  data_length: ",0xf);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ext_tcode: ",0xd);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    lVar14 = *(long *)poVar6;
    lVar9 = *(long *)(lVar14 + -0x18);
    *(uint *)(poVar6 + lVar9 + 0x18) = *(uint *)(poVar6 + lVar9 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((uVar3 & 0x30000) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (out,"WARNING: data_length is not a multiple of 4",0x2b);
      lVar14 = *(long *)out;
      poVar6 = out;
LAB_00116aeb:
      std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  else {
    local_50 = 0;
    if (bVar2 < 0x10 || bVar10 == 6) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"  data: ",8);
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      lVar14 = *(long *)poVar6;
      *(uint *)(poVar6 + *(long *)(lVar14 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(lVar14 + -0x18) + 0x18) & 0xffffffb5 | 2;
      local_50 = 0;
      goto LAB_00116aeb;
    }
  }
  if (bVar10 == 4) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"  header_crc: ",0xe);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  }
  else {
    if (max_quads == 4) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"  header_crc: ",0xe);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    lVar14 = *(long *)poVar6;
    lVar9 = *(long *)(lVar14 + -0x18);
    *(uint *)(poVar6 + lVar9 + 0x18) = *(uint *)(poVar6 + lVar9 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((bVar10 != 7) && (bVar10 != 1)) {
      return;
    }
    uVar3 = (uint)(local_50 >> 2);
    uVar13 = max_quads - 5;
    uVar5 = uVar13;
    if (uVar3 < uVar13) {
      uVar5 = uVar3;
    }
    if (uVar5 != 0) {
      lVar14 = 1;
      uVar12 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"  data[",7);
        lVar9 = *(long *)out;
        *(uint *)(out + *(long *)(lVar9 + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(lVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar6 = out + *(long *)(lVar9 + -0x18);
        if (out[*(long *)(lVar9 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar6);
          poVar6[0xe1] = (ostream)0x1;
          lVar9 = *(long *)out;
        }
        poVar6[0xe0] = (ostream)0x20;
        *(undefined8 *)(out + *(long *)(lVar9 + -0x18) + 0x10) = 3;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 3;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]:  ",4);
        uVar11 = 0;
        do {
          lVar9 = *(long *)out;
          *(uint *)(out + *(long *)(lVar9 + -0x18) + 0x18) =
               *(uint *)(out + *(long *)(lVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(out + *(long *)(lVar9 + -0x18) + 0x10) = 8;
          poVar6 = out + *(long *)(lVar9 + -0x18);
          if (out[*(long *)(lVar9 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar6);
            poVar6[0xe1] = (ostream)0x1;
          }
          poVar6[0xe0] = (ostream)0x30;
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
          *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
        } while ((uVar11 < 3) && (uVar1 = lVar14 + uVar11, uVar11 = uVar11 + 1, uVar1 < uVar5));
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        uVar12 = uVar12 + 4;
        lVar14 = lVar14 + 4;
      } while (uVar12 < uVar5);
    }
    if ((uint)local_50 < 4 || uVar13 <= uVar3) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"  data_crc: ",0xc);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  }
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  lVar14 = *(long *)poVar6;
  *(uint *)(poVar6 + *(long *)(lVar14 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(lVar14 + -0x18) + 0x18) & 0xffffffb5 | 2;
LAB_00116b69:
  std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void EthBasePort::PrintFirewirePacket(std::ostream &out, const quadlet_t *packet, unsigned int max_quads)
{
    static const char *tcode_name[16] = { "qwrite", "bwrite", "wresponse", "", "qread", "bread",
                                          "qresponse", "bresponse", "cycstart", "lockreq",
                                          "stream", "lockresp", "", "", "", "" };
    unsigned char tcode = (packet[0]&0x000000F0)>>4;
    unsigned int data_length = 0;
    // No point in printing anything if less than 4
    if (max_quads < 4) {
        out << "PrintPacket: should print more than 4 quadlets (max_quads = "
            << max_quads << ")" << std::endl;
        return;
    }
    out << "Firewire Packet:" << std::endl;
    out << "  dest: " << std::hex << ((packet[0]&0xffc00000)>>20)
        << ", node: " << std::dec << ((packet[0]&0x003f0000)>>16)
        << ", tl: " << std::hex << std::setw(2) << std::setfill('0') << ((packet[0]&0x0000fc00)>>10)
        << ", rt: " << ((packet[0]&0x00000300)>>8)
        << ", tcode: " << static_cast<unsigned int>(tcode) << " (" << tcode_name[tcode] << ")"
        << ", pri: " << (packet[0]&0x0000000F) << std::endl;
    out << "  src: " << std::hex << ((packet[1]&0xffc00000)>>20)
        << ", node: " << std::dec << ((packet[1]&0x003f0000)>>16);

    if ((tcode == QRESPONSE) || (tcode == BRESPONSE)) {
        out << ", rcode: " << std::dec << ((packet[1]&0x0000f0000)>>12);
    }
    else if ((tcode == QWRITE) || (tcode == QREAD) || (tcode == BWRITE) || (tcode == BREAD)) {
        out << ", dest_off: " << std::hex << (packet[1]&0x0000ffff) << std::endl;
        out << "  dest_off: " << packet[2] << std::dec;
    }
    out << std::endl;

    if ((tcode == BWRITE) || (tcode == BRESPONSE) || (tcode == BREAD)) {
        data_length = (packet[3]&0xffff0000) >> 16;
        out << "  data_length: " << std::dec << data_length
            << ", ext_tcode: " << std::hex << (packet[3]&0x0000ffff) << std::dec << std::endl;
        if (data_length%4 != 0)
            out << "WARNING: data_length is not a multiple of 4" << std::endl;
    }
    else if ((tcode == QWRITE) || (tcode == QRESPONSE)) {
        out << "  data: " << std::hex << packet[3] << std::dec << std::endl;
    }

    if (tcode == QREAD)
        out << "  header_crc: " << std::hex << packet[3] << std::dec << std::endl;
    else if (max_quads < 5)  // Nothing else to do for short packets
        return;
    else
        out << "  header_crc: " << std::hex << packet[4] << std::dec << std::endl;

    if ((tcode == BWRITE) || (tcode == BRESPONSE)) {
        data_length /= sizeof(quadlet_t);   // data_length in quadlets
        unsigned int lim = (data_length <= max_quads-5) ? data_length : max_quads-5;
        for (unsigned int i = 0; i < lim; i += 4) {
            out << "  data[" << std::dec << std::setfill(' ') << std::setw(3) << i << ":"
                << std::setw(3) << (i+3) << "]:  ";
            for (unsigned int j = 0; (j < 4) && ((i+j) < lim); j++)
                out << std::hex << std::setw(8) << std::setfill('0') << packet[5+i+j] << std::dec << "  ";
            out << std::endl;
        }
        if ((data_length > 0) && (data_length < max_quads-5))
            out << "  data_crc: " << std::hex << packet[5+data_length] << std::dec << std::endl;
    }
}